

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

void __thiscall soul::FunctionBuilder::addReturn(FunctionBuilder *this,Expression *value)

{
  PoolItem *pPVar1;
  pool_ptr<soul::heart::Block> local_18;
  
  pPVar1 = PoolAllocator::allocateSpaceForObject
                     (&((this->super_BlockBuilder).module)->allocator->pool,0x20);
  *(undefined8 *)&pPVar1->field_0x18 = 0;
  pPVar1[1].size = 0;
  pPVar1->item = &PTR__ReturnValue_002d0538;
  pPVar1[1].destructor = (DestructorFn *)value;
  pPVar1->destructor =
       PoolAllocator::allocate<soul::heart::ReturnValue,_soul::heart::Expression_&>::
       anon_class_1_0_00000001::__invoke;
  local_18.object = (Block *)0x0;
  addTerminatorStatement(this,(Terminator *)&pPVar1->item,&local_18);
  return;
}

Assistant:

void addReturn (heart::Expression& value)
    {
        addTerminatorStatement (module.allocate<heart::ReturnValue> (value), nullptr);
    }